

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall icu_63::Calendar::computeWeekFields(Calendar *this,UErrorCode *ec)

{
  byte bVar1;
  UCalendarDaysOfWeek UVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int32_t iVar10;
  int iVar11;
  
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar6 = this->fFields[0x13];
    iVar9 = this->fFields[6];
    iVar11 = this->fFields[7];
    UVar2 = this->fFirstDayOfWeek;
    iVar3 = iVar9 + UVar2;
    iVar4 = iVar11 - iVar3;
    iVar3 = (int)((ulong)((long)((iVar11 - iVar3) + 0x1b59) * -0x6db6db6d) >> 0x20) + iVar4 + 0x1b59
    ;
    iVar3 = ((iVar3 >> 2) - (iVar3 >> 0x1f)) * -7 + iVar4 + 0x1b59;
    iVar4 = iVar9 + iVar3 + (int)((ulong)((long)(iVar9 + iVar3 + -1) * -0x6db6db6d) >> 0x20) + -1;
    iVar10 = (uint)((uint)this->fMinimalDaysInFirstWeek <= 7U - iVar3) +
             ((iVar4 >> 2) - (iVar4 >> 0x1f));
    if (iVar10 == 0) {
      iVar6 = iVar6 + -1;
      iVar4 = (*(this->super_UObject)._vptr_UObject[0x23])(this);
      iVar4 = iVar4 + iVar9;
      iVar9 = iVar11 - (this->fFirstDayOfWeek + iVar4);
      iVar3 = (int)((ulong)((long)(iVar9 + 1) * -0x6db6db6d) >> 0x20) + iVar9 + 1;
      iVar3 = ((iVar3 >> 2) - (iVar3 >> 0x1f)) * -7;
      iVar7 = iVar9 + iVar3 + 1;
      iVar3 = iVar9 + 8 + iVar3;
      if (-1 < iVar7) {
        iVar3 = iVar7;
      }
      iVar9 = (int)((ulong)((long)(iVar3 + iVar4 + -1) * -0x6db6db6d) >> 0x20) + iVar4 + iVar3 + -1;
      uVar5 = (uint)this->fMinimalDaysInFirstWeek;
      iVar10 = (((iVar9 >> 2) - (iVar9 >> 0x1f)) + 1) -
               (uint)(7U - iVar3 < (uint)this->fMinimalDaysInFirstWeek);
    }
    else {
      iVar3 = (*(this->super_UObject)._vptr_UObject[0x23])(this);
      bVar1 = this->fMinimalDaysInFirstWeek;
      uVar5 = (uint)bVar1;
      if (iVar3 + -5 <= iVar9) {
        iVar4 = iVar11 - UVar2;
        iVar7 = (int)((ulong)((long)(iVar4 + 7) * -0x6db6db6d) >> 0x20) + iVar4 + 7;
        iVar7 = iVar4 + ((iVar7 >> 2) - (iVar7 >> 0x1f)) * -7 + 7;
        iVar4 = (iVar7 - iVar9) + iVar3;
        iVar8 = iVar4 % 7;
        iVar4 = iVar4 % 7 + 7;
        if (-1 < iVar8) {
          iVar4 = iVar8;
        }
        if ((uint)bVar1 <= 6U - iVar4) {
          iVar9 = (iVar9 - iVar7) + 7;
          if (iVar3 < iVar9) {
            iVar10 = 1;
          }
          iVar6 = iVar6 + (uint)(iVar3 < iVar9);
          uVar5 = (uint)bVar1;
        }
      }
    }
    this->fFields[3] = iVar10;
    this->fFields[0x11] = iVar6;
    iVar3 = this->fFields[5];
    iVar11 = iVar11 - (this->fFirstDayOfWeek + iVar3);
    iVar6 = (int)((ulong)((long)(iVar11 + 1) * -0x6db6db6d) >> 0x20) + iVar11 + 1;
    iVar6 = ((iVar6 >> 2) - (iVar6 >> 0x1f)) * -7;
    iVar9 = iVar11 + iVar6 + 1;
    iVar6 = iVar11 + 8 + iVar6;
    if (-1 < iVar9) {
      iVar6 = iVar9;
    }
    this->fFields[4] = ((iVar6 + iVar3 + -1) / 7 + 1) - (uint)(7U - iVar6 < uVar5);
    iVar3 = iVar3 + (int)((ulong)((long)(iVar3 + -1) * -0x6db6db6d) >> 0x20) + -1;
    this->fFields[8] = ((iVar3 >> 2) - (iVar3 >> 0x1f)) + 1;
    return;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }